

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

HashEntry * raviX_hash_table_insert_pre_hashed(HashTable *ht,uint32_t hash,void *key,void *data)

{
  HashEntry *pHVar1;
  uint32_t *puVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint32_t new_size_index;
  HashEntry *pHVar6;
  HashEntry *local_38;
  
  if (ht->entries < ht->max_entries) {
    if (ht->entries + ht->deleted_entries < ht->max_entries) goto LAB_0010d453;
    new_size_index = ht->size_index;
  }
  else {
    new_size_index = ht->size_index + 1;
  }
  hash_table_rehash(ht,new_size_index);
LAB_0010d453:
  pHVar6 = (HashEntry *)0x0;
  uVar3 = (ulong)hash % (ulong)ht->size;
  uVar5 = uVar3;
  do {
    pHVar1 = ht->table + uVar5;
    puVar2 = (uint32_t *)pHVar1->key;
    if (puVar2 == (uint32_t *)0x0 || puVar2 == &deleted_key_value) {
      if (pHVar6 == (HashEntry *)0x0) {
        pHVar6 = pHVar1;
      }
      if (puVar2 != (uint32_t *)0x0) goto LAB_0010d497;
      iVar4 = 2;
    }
    else {
LAB_0010d497:
      if (((puVar2 == &deleted_key_value) || (pHVar1->hash != hash)) ||
         (iVar4 = (*ht->key_equals_function)(key,puVar2), iVar4 == 0)) {
        iVar4 = 0;
        uVar5 = (ulong)((int)uVar5 + 1 + hash % ht->rehash) % (ulong)ht->size;
      }
      else {
        pHVar1->key = key;
        pHVar1->data = data;
        iVar4 = 1;
        local_38 = pHVar1;
      }
    }
    if (iVar4 != 0) {
      if (iVar4 != 2) {
        return local_38;
      }
      goto LAB_0010d50b;
    }
    if ((int)uVar5 == (int)uVar3) {
LAB_0010d50b:
      if (pHVar6 == (HashEntry *)0x0) {
        pHVar6 = (HashEntry *)0x0;
      }
      else {
        if ((uint32_t *)pHVar6->key == &deleted_key_value) {
          ht->deleted_entries = ht->deleted_entries - 1;
        }
        pHVar6->hash = hash;
        pHVar6->key = key;
        pHVar6->data = data;
        ht->entries = ht->entries + 1;
      }
      return pHVar6;
    }
  } while( true );
}

Assistant:

HashEntry *
raviX_hash_table_insert_pre_hashed(HashTable *ht, uint32_t hash,
			     const void *key, void *data)
{
	uint32_t start_hash_address, hash_address;
	HashEntry *available_entry = NULL;

	if (ht->entries >= ht->max_entries) {
		hash_table_rehash(ht, ht->size_index + 1);
	} else if (ht->deleted_entries + ht->entries >= ht->max_entries) {
		hash_table_rehash(ht, ht->size_index);
	}

	start_hash_address = hash % ht->size;
	hash_address = start_hash_address;
	do {
		HashEntry *entry = ht->table + hash_address;
		uint32_t double_hash;

		if (!entry_is_present(entry)) {
			/* Stash the first available entry we find */
			if (available_entry == NULL)
				available_entry = entry;
			if (entry_is_free(entry))
				break;
		}

		/* Implement replacement when another insert happens
		 * with a matching key.  This is a relatively common
		 * feature of hash tables, with the alternative
		 * generally being "insert the new value as well, and
		 * return it first when the key is searched for".
		 *
		 * Note that the hash table doesn't have a delete
		 * callback.  If freeing of old data pointers is
		 * required to avoid memory leaks, perform a search
		 * before inserting.
		 */
		if (!entry_is_deleted(entry) &&
		    entry->hash == hash &&
		    ht->key_equals_function(key, entry->key)) {
			entry->key = key;
			entry->data = data;
			return entry;
		}


		double_hash = 1 + hash % ht->rehash;

		hash_address = (hash_address + double_hash) % ht->size;
	} while (hash_address != start_hash_address);

	if (available_entry) {
		if (entry_is_deleted(available_entry))
			ht->deleted_entries--;
		available_entry->hash = hash;
		available_entry->key = key;
		available_entry->data = data;
		ht->entries++;
		return available_entry;
	}

	/* We could hit here if a required resize failed. An unchecked-malloc
	 * application could ignore this result.
	 */
	return NULL;
}